

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O0

void __thiscall Vault::KeyValue::KeyValue(KeyValue *this,Client *client,Version version)

{
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Version local_1c;
  Client *pCStack_18;
  Version version_local;
  Client *client_local;
  KeyValue *this_local;
  
  this->client_ = client;
  this->version_ = version;
  local_1c = version;
  pCStack_18 = client;
  client_local = (Client *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"secret",&local_41);
  Tiny<Vault::SecretMountDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&this->mount_,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

Vault::KeyValue::KeyValue(const Vault::Client &client,
                          KeyValue::Version version)
    : client_(client)
    , version_(version)
    , mount_("secret") {}